

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

p_ply ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  FILE *__stream;
  p_ply ptVar1;
  code *error_cb_00;
  
  error_cb_00 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    error_cb_00 = error_cb;
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    ptVar1 = (p_ply)0x0;
    (*error_cb_00)((p_ply)0x0,"Unable to open file");
  }
  else {
    ptVar1 = ply_open_from_file((FILE *)__stream,error_cb_00,idata,pdata);
    if (ptVar1 == (p_ply)0x0) {
      fclose(__stream);
    }
    else {
      ptVar1->own_fp = 1;
    }
  }
  return ptVar1;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    FILE *fp;
    p_ply ply;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(name);
    fp = fopen(name, "rb");
    if (!fp) {
        error_cb(NULL, "Unable to open file");
        return NULL;
    }
    ply = ply_open_from_file(fp, error_cb, idata, pdata);
    if (ply) ply->own_fp = 1;
    else fclose(fp);
    return ply;
}